

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bt_peer_connection.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::bt_peer_connection::write_hash_request(bt_peer_connection *this,hash_request *req)

{
  _Atomic_word *p_Var1;
  pointer *pphVar2;
  int iVar3;
  uint uVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  iterator __position;
  int iVar6;
  char *pcVar7;
  int iVar8;
  uint val;
  char *pcVar9;
  element_type *peVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar11;
  span<const_char> buf_00;
  sha256_hash root;
  char buf [53];
  
  iVar8 = 0x18;
  pcVar7 = buf;
  do {
    pcVar9 = pcVar7;
    *pcVar9 = (char)(0x31 >> ((byte)iVar8 & 0x1f));
    iVar8 = iVar8 + -8;
    pcVar7 = pcVar9 + 1;
  } while (iVar8 != -8);
  pcVar9[1] = '\x15';
  peVar10 = (this->super_peer_connection).super_peer_connection_hot_members.m_torrent.
            super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var5 = (this->super_peer_connection).super_peer_connection_hot_members.m_torrent.
           super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  this_00 = p_Var5;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var5->_M_weak_count = p_Var5->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      p_Var5->_M_weak_count = p_Var5->_M_weak_count + 1;
    }
    if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      iVar8 = p_Var5->_M_use_count;
      do {
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (iVar8 == 0) break;
        LOCK();
        iVar3 = p_Var5->_M_use_count;
        bVar11 = iVar8 == iVar3;
        if (bVar11) {
          p_Var5->_M_use_count = iVar8 + 1;
          iVar3 = iVar8;
        }
        iVar8 = iVar3;
        UNLOCK();
        this_00 = p_Var5;
      } while (!bVar11);
    }
  }
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    peVar10 = (element_type *)0x0;
  }
  else if (this_00->_M_use_count == 0) {
    peVar10 = (element_type *)0x0;
  }
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var5->_M_weak_count;
      iVar8 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar8 = p_Var5->_M_weak_count;
      p_Var5->_M_weak_count = iVar8 + -1;
    }
    if (iVar8 == 1) {
      (*p_Var5->_vptr__Sp_counted_base[3])();
    }
  }
  if (peVar10 != (element_type *)0x0) {
    file_storage::root(&root,&((peVar10->super_torrent_hot_members).m_torrent_file.
                               super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->m_files,(file_index_t)(req->file).m_val);
    *(undefined8 *)(pcVar9 + 0x12) = root.m_number._M_elems._16_8_;
    *(undefined8 *)(pcVar9 + 0x1a) = root.m_number._M_elems._24_8_;
    *(undefined8 *)(pcVar9 + 2) = root.m_number._M_elems._0_8_;
    *(undefined8 *)(pcVar9 + 10) = root.m_number._M_elems._8_8_;
    pcVar7 = buf + 0x25;
    uVar4 = req->base;
    iVar8 = 0x18;
    do {
      *pcVar7 = (char)(uVar4 >> ((byte)iVar8 & 0x1f));
      pcVar7 = pcVar7 + 1;
      iVar8 = iVar8 + -8;
    } while (iVar8 != -8);
    uVar4 = req->index;
    iVar8 = 0x18;
    do {
      *pcVar7 = (char)(uVar4 >> ((byte)iVar8 & 0x1f));
      pcVar7 = pcVar7 + 1;
      iVar8 = iVar8 + -8;
    } while (iVar8 != -8);
    uVar4 = req->count;
    iVar8 = 0x18;
    do {
      *pcVar7 = (char)(uVar4 >> ((byte)iVar8 & 0x1f));
      pcVar7 = pcVar7 + 1;
      iVar8 = iVar8 + -8;
    } while (iVar8 != -8);
    uVar4 = req->proof_layers;
    iVar8 = 0x18;
    do {
      *pcVar7 = (char)(uVar4 >> ((byte)iVar8 & 0x1f));
      pcVar7 = pcVar7 + 1;
      iVar8 = iVar8 + -8;
    } while (iVar8 != -8);
    counters::inc_stats_counter((this->super_peer_connection).m_counters,0x68,1);
    __position._M_current =
         (this->m_hash_requests).
         super__Vector_base<libtorrent::aux::hash_request,_std::allocator<libtorrent::aux::hash_request>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->m_hash_requests).
        super__Vector_base<libtorrent::aux::hash_request,_std::allocator<libtorrent::aux::hash_request>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      ::std::vector<libtorrent::aux::hash_request,std::allocator<libtorrent::aux::hash_request>>::
      _M_realloc_insert<libtorrent::aux::hash_request_const&>
                ((vector<libtorrent::aux::hash_request,std::allocator<libtorrent::aux::hash_request>>
                  *)&this->m_hash_requests,__position,req);
    }
    else {
      (__position._M_current)->proof_layers = req->proof_layers;
      iVar8 = req->base;
      iVar3 = req->index;
      iVar6 = req->count;
      (__position._M_current)->file = (file_index_t)(req->file).m_val;
      (__position._M_current)->base = iVar8;
      (__position._M_current)->index = iVar3;
      (__position._M_current)->count = iVar6;
      pphVar2 = &(this->m_hash_requests).
                 super__Vector_base<libtorrent::aux::hash_request,_std::allocator<libtorrent::aux::hash_request>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *pphVar2 = *pphVar2 + 1;
    }
    bVar11 = peer_connection::should_log(&this->super_peer_connection,outgoing_message);
    if (bVar11) {
      peer_connection::peer_log
                (&this->super_peer_connection,outgoing_message,"HASH_REQUEST",
                 "file: %d base: %d idx: %d cnt: %d proofs: %d",(ulong)(uint)(req->file).m_val,
                 (ulong)(uint)req->base,(ulong)(uint)req->index,(ulong)(uint)req->count,
                 (ulong)(uint)req->proof_layers);
    }
    buf_00.m_len = 0x35;
    buf_00.m_ptr = buf;
    peer_connection::send_buffer(&this->super_peer_connection,buf_00);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

void bt_peer_connection::write_hash_request(hash_request const& req)
	{
		INVARIANT_CHECK;

		char buf[5 + sha256_hash::size() + 4 * 4];
		char* ptr = buf;
		aux::write_uint32(int(sizeof(buf) - 4), ptr);
		aux::write_uint8(msg_hash_request, ptr);

		auto t = associated_torrent().lock();
		if (!t) return;
		auto const& ti = t->torrent_file();
		auto const& fs = ti.files();
		auto const root = fs.root(req.file);

		ptr = std::copy(root.begin(), root.end(), ptr);

		TORRENT_ASSERT(validate_hash_request(req, t->torrent_file().files()));

		aux::write_uint32(req.base, ptr);
		aux::write_uint32(req.index, ptr);
		aux::write_uint32(req.count, ptr);
		aux::write_uint32(req.proof_layers, ptr);

		stats_counters().inc_stats_counter(counters::num_outgoing_hash_request);

		m_hash_requests.push_back(req);

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log(peer_log_alert::outgoing_message))
		{
			peer_log(peer_log_alert::outgoing_message, "HASH_REQUEST"
				, "file: %d base: %d idx: %d cnt: %d proofs: %d"
				, int(req.file), req.base, req.index, req.count, req.proof_layers);
		}
#endif

		send_buffer(buf);
	}